

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_coc_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  undefined8 in_RAX;
  int in_ECX;
  int iVar2;
  jpc_coxcp_t *in_R8;
  jpc_coxcp_t *in_00;
  uint_fast8_t tmp;
  
  tmp = (uint_fast8_t)((ulong)in_RAX >> 0x38);
  iVar2 = -1;
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_getuint8(in,&tmp);
    if (iVar1 != 0) {
      return -1;
    }
    *(ulong *)&ms->parms = (ulong)tmp;
  }
  else {
    iVar1 = jpc_getuint16(in,(uint_fast16_t *)&(ms->parms).soc);
    if (iVar1 != 0) {
      return -1;
    }
  }
  in_00 = &(ms->parms).coc.compparms;
  iVar1 = jpc_getuint8(in,&in_00->csty);
  if ((iVar1 == 0) &&
     (iVar1 = jpc_cox_getcompparms
                        ((jpc_ms_t *)in,(jpc_cstate_t *)(ulong)(in_00->csty & 1),
                         (jas_stream_t *)in_00,in_ECX,in_R8), iVar1 == 0)) {
    iVar2 = -(in->flags_ & 1U);
  }
  return iVar2;
}

Assistant:

static int jpc_coc_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_coc_t *coc = &ms->parms.coc;
	uint_fast8_t tmp;
	if (cstate->numcomps <= 256) {
		if (jpc_getuint8(in, &tmp)) {
			return -1;
		}
		coc->compno = tmp;
	} else {
		if (jpc_getuint16(in, &coc->compno)) {
			return -1;
		}
	}
	if (jpc_getuint8(in, &coc->compparms.csty)) {
		return -1;
	}
	if (jpc_cox_getcompparms(ms, cstate, in,
	  (coc->compparms.csty & JPC_COX_PRT) != 0, &coc->compparms)) {
		return -1;
	}
	if (jas_stream_eof(in)) {
		return -1;
	}
	return 0;
}